

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O1

void main_sheet_list_expat_callback_element_start(void *callbackdata,XML_Char *name,XML_Char **atts)

{
  code *pcVar1;
  int iVar2;
  XML_Char *pXVar3;
  
  if ((callbackdata != (void *)0x0) &&
     (pcVar1 = *(code **)((long)callbackdata + 8), pcVar1 != (code *)0x0)) {
    iVar2 = XML_Char_icmp_ins(name,"sheet");
    if (iVar2 == 0) {
      pXVar3 = get_expat_attr_by_name(atts,"name");
      if (pXVar3 != (XML_Char *)0x0) {
        iVar2 = (*pcVar1)(pXVar3,*(undefined8 *)((long)callbackdata + 0x10));
        if (iVar2 != 0) {
          XML_StopParser(*callbackdata,0);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void main_sheet_list_expat_callback_element_start (void* callbackdata, const XML_Char* name, const XML_Char** atts)
{
  struct main_sheet_list_callback_data* data = (struct main_sheet_list_callback_data*)callbackdata;
  if (data && data->callback) {
    if (XML_Char_icmp_ins(name, X("sheet")) == 0) {
      const XML_Char* sheetname;
      //const XML_Char* relid = get_expat_attr_by_name(atts, X("r:id"));
      if ((sheetname = get_expat_attr_by_name(atts, X("name"))) != NULL) {
        if (data->callback) {
          if ((*data->callback)(sheetname, data->callbackdata) != 0) {
            XML_StopParser(data->xmlparser, XML_FALSE);
            return;
          }
/*
        } else {
          //for non-calback method suspend here
          XML_StopParser(data->xmlparser, XML_TRUE);
*/
        }
      }
    }
  }
}